

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O0

void * __thiscall
DefaultSysAllocator::Alloc
          (DefaultSysAllocator *this,size_t size,size_t *actual_size,size_t alignment)

{
  int iVar1;
  undefined4 extraout_var;
  int local_44;
  int i_1;
  void *result;
  int i;
  size_t alignment_local;
  size_t *actual_size_local;
  size_t size_local;
  DefaultSysAllocator *this_local;
  
  result._4_4_ = 0;
  do {
    if (1 < result._4_4_) {
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        this->failed_[local_44] = false;
      }
      return (void *)0x0;
    }
    if (((this->failed_[result._4_4_] & 1U) == 0) &&
       (this->allocs_[result._4_4_] != (SysAllocator *)0x0)) {
      iVar1 = (*this->allocs_[result._4_4_]->_vptr_SysAllocator[2])
                        (this->allocs_[result._4_4_],size,actual_size,alignment);
      if ((void *)CONCAT44(extraout_var,iVar1) != (void *)0x0) {
        return (void *)CONCAT44(extraout_var,iVar1);
      }
      this->failed_[result._4_4_] = true;
    }
    result._4_4_ = result._4_4_ + 1;
  } while( true );
}

Assistant:

void* DefaultSysAllocator::Alloc(size_t size, size_t *actual_size,
                                 size_t alignment) {
  for (int i = 0; i < kMaxAllocators; i++) {
    if (!failed_[i] && allocs_[i] != nullptr) {
      void* result = allocs_[i]->Alloc(size, actual_size, alignment);
      if (result != nullptr) {
        return result;
      }
      failed_[i] = true;
    }
  }
  // After both failed, reset "failed_" to false so that a single failed
  // allocation won't make the allocator never work again.
  for (int i = 0; i < kMaxAllocators; i++) {
    failed_[i] = false;
  }
  return nullptr;
}